

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationIterator::fetchCEs(CollationIterator *this,UErrorCode *errorCode)

{
  int32_t iVar1;
  int64_t iVar2;
  
  while( true ) {
    if (U_ZERO_ERROR < *errorCode) {
      return (this->ceBuffer).length;
    }
    iVar2 = nextCE(this,errorCode);
    iVar1 = (this->ceBuffer).length;
    if (iVar2 == 0x101000100) break;
    this->cesIndex = iVar1;
  }
  return iVar1;
}

Assistant:

int32_t
CollationIterator::fetchCEs(UErrorCode &errorCode) {
    while(U_SUCCESS(errorCode) && nextCE(errorCode) != Collation::NO_CE) {
        // No need to loop for each expansion CE.
        cesIndex = ceBuffer.length;
    }
    return ceBuffer.length;
}